

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddBezierQuadratic
          (ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImU32 col,float thickness,
          int num_segments)

{
  ImDrawList *in_RCX;
  undefined8 in_RDX;
  int num_segments_00;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  uint in_R8D;
  float in_R9D;
  ImDrawFlags in_XMM0_Da;
  ImDrawList *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd0;
  
  num_segments_00 = (int)((ulong)in_RDX >> 0x20);
  if ((in_R8D & 0xff000000) != 0) {
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI);
    PathBezierQuadraticCurveTo(unaff_retaddr,in_RDI,in_RSI,num_segments_00);
    PathStroke(in_RCX,in_R8D,in_XMM0_Da,in_R9D);
  }
  return;
}

Assistant:

void ImDrawList::AddBezierQuadratic(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, ImU32 col, float thickness, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathBezierQuadraticCurveTo(p2, p3, num_segments);
    PathStroke(col, 0, thickness);
}